

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O0

void __thiscall E64::blitter_ic::terminal_putsymbol(blitter_ic *this,uint8_t number,char symbol)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  long lVar4;
  undefined1 in_DL;
  byte in_SIL;
  long in_RDI;
  uint8_t in_stack_0000004f;
  blitter_ic *in_stack_00000050;
  undefined4 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff4;
  
  terminal_putsymbol_at_cursor
            ((blitter_ic *)
             CONCAT17(in_SIL,CONCAT16(in_DL,CONCAT24(in_stack_fffffffffffffff4,
                                                     in_stack_fffffffffffffff0))),
             (uint8_t)((ulong)in_RDI >> 0x38),(char)((ulong)in_RDI >> 0x30));
  lVar4 = *(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140;
  *(short *)(lVar4 + 0x34) = *(short *)(lVar4 + 0x34) + 1;
  uVar3 = (uint)*(ushort *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34);
  uVar2 = blit_t::get_tiles((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
  if ((int)(uint)uVar2 <= (int)uVar3) {
    terminal_add_bottom_row(in_stack_00000050,in_stack_0000004f);
    bVar1 = blit_t::get_columns((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
    lVar4 = *(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140;
    *(ushort *)(lVar4 + 0x34) = *(short *)(lVar4 + 0x34) - (ushort)bVar1;
  }
  return;
}

Assistant:

void E64::blitter_ic::terminal_putsymbol(uint8_t number, char symbol)
{
	terminal_putsymbol_at_cursor(number, symbol);
	blit[number].cursor_position++;
	if (blit[number].cursor_position >= blit[number].get_tiles()) {
		terminal_add_bottom_row(number);
		blit[number].cursor_position -= blit[number].get_columns();
	}
}